

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O0

void __thiscall Stat_scancycles::Stat_scancycles(Stat_scancycles *this)

{
  Stat_scancycles *this_local;
  
  FStat::FStat(&this->super_FStat,"scancycles");
  (this->super_FStat)._vptr_FStat = (_func_int **)&PTR__Stat_scancycles_00b61210;
  return;
}

Assistant:

ADD_STAT (scancycles)
{
	FString out;
	double scancycles = WallScanCycles.Time();
	if (scancycles && scancycles < bestscancycles)
		bestscancycles = scancycles;
	out.Format ("%g", bestscancycles);
	return out;
}